

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profiler_unittest.cc
# Opt level: O1

void Allocate(int start,int end,int size)

{
  void *pvVar1;
  long lVar2;
  
  marker = "Allocate";
  if (0 < start) {
    lVar2 = 0;
    do {
      pvVar1 = operator_new__((ulong)(uint)end << 2);
      *(void **)((long)g_array + lVar2) = pvVar1;
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)start << 3 != lVar2);
  }
  return;
}

Assistant:

static ATTRIBUTE_NOINLINE void Allocate(int start, int end, int size) {
  // NOTE: we're using this to prevent gcc 5 from merging otherwise
  // identical Allocate & Allocate2 functions.
  marker = "Allocate";
  for (int i = start; i < end; ++i) {
    if (i < kMaxCount)
      g_array[i] = new int[size];
  }
}